

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O2

MESSAGE_QUEUE_HANDLE message_queue_create(MESSAGE_QUEUE_CONFIG *config)

{
  size_t sVar1;
  MESSAGE_QUEUE_HANDLE message_queue;
  SINGLYLINKEDLIST_HANDLE pSVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (config == (MESSAGE_QUEUE_CONFIG *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (MESSAGE_QUEUE_HANDLE)0x0;
    }
    pcVar5 = "invalid configuration (NULL)";
    iVar4 = 0x1ca;
LAB_0013f14f:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
              ,"message_queue_create",iVar4,1,pcVar5);
    return (MESSAGE_QUEUE_HANDLE)0x0;
  }
  if (config->on_process_message_callback == (PROCESS_MESSAGE_CALLBACK)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (MESSAGE_QUEUE_HANDLE)0x0;
    }
    pcVar5 = "invalid configuration (on_process_message_callback is NULL)";
    iVar4 = 0x1cf;
    goto LAB_0013f14f;
  }
  message_queue = (MESSAGE_QUEUE_HANDLE)calloc(1,0x40);
  if (message_queue == (MESSAGE_QUEUE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (MESSAGE_QUEUE_HANDLE)0x0;
    }
    pcVar5 = "failed allocating MESSAGE_QUEUE";
    iVar4 = 0x1d4;
    goto LAB_0013f14f;
  }
  pSVar2 = singlylinkedlist_create();
  message_queue->pending = pSVar2;
  if (pSVar2 == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013f1b7;
    pcVar5 = "failed allocating MESSAGE_QUEUE pending list";
    iVar4 = 0x1de;
  }
  else {
    pSVar2 = singlylinkedlist_create();
    message_queue->in_progress = pSVar2;
    if (pSVar2 != (SINGLYLINKEDLIST_HANDLE)0x0) {
      sVar1 = config->max_message_processing_time_secs;
      message_queue->max_message_enqueued_time_secs = config->max_message_enqueued_time_secs;
      message_queue->max_message_processing_time_secs = sVar1;
      message_queue->max_retry_count = config->max_retry_count;
      message_queue->on_process_message_callback = config->on_process_message_callback;
      return message_queue;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013f1b7;
    pcVar5 = "failed allocating MESSAGE_QUEUE in-progress list";
    iVar4 = 0x1e4;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
            ,"message_queue_create",iVar4,1,pcVar5);
LAB_0013f1b7:
  message_queue_destroy(message_queue);
  return (MESSAGE_QUEUE_HANDLE)0x0;
}

Assistant:

MESSAGE_QUEUE_HANDLE message_queue_create(MESSAGE_QUEUE_CONFIG* config)
{
    MESSAGE_QUEUE* result;

    if (config == NULL)
    {
        LogError("invalid configuration (NULL)");
        result = NULL;
    }
    else if (config->on_process_message_callback == NULL)
    {
        LogError("invalid configuration (on_process_message_callback is NULL)");
        result = NULL;
    }
    else if ((result = (MESSAGE_QUEUE*)malloc(sizeof(MESSAGE_QUEUE))) == NULL)
    {
        LogError("failed allocating MESSAGE_QUEUE");
        result = NULL;
    }
    else
    {
        // Here it already sets the id_counter to zero.
        memset(result, 0, sizeof(MESSAGE_QUEUE));

        if ((result->pending = singlylinkedlist_create()) == NULL)
        {
            LogError("failed allocating MESSAGE_QUEUE pending list");
            message_queue_destroy(result);
            result = NULL;
        }
        else if ((result->in_progress = singlylinkedlist_create()) == NULL)
        {
            LogError("failed allocating MESSAGE_QUEUE in-progress list");
            message_queue_destroy(result);
            result = NULL;
        }
        else
        {

            result->max_message_enqueued_time_secs = config->max_message_enqueued_time_secs;
            result->max_message_processing_time_secs = config->max_message_processing_time_secs;
            result->max_retry_count = config->max_retry_count;
            result->on_process_message_callback = config->on_process_message_callback;
        }
    }

    return result;
}